

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  ulong uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ushort uVar12;
  unkuint9 Var13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  uint5 uVar18;
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  ulong uVar21;
  uint8_t *puVar22;
  uint8_t uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  short sVar26;
  int iVar27;
  undefined1 uVar32;
  short sVar33;
  short sVar35;
  undefined1 auVar28 [16];
  short sVar31;
  undefined1 uVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 uVar36;
  undefined4 uVar37;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 auVar40 [16];
  undefined1 uVar49;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 uVar51;
  undefined1 uVar55;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar62 [16];
  undefined5 uVar38;
  undefined6 uVar39;
  undefined1 uVar50;
  undefined1 auVar54 [16];
  undefined1 uVar59;
  undefined1 uVar60;
  undefined1 uVar61;
  
  uVar11 = *(uint *)top;
  auVar14[0xc] = (char)(uVar11 >> 0x18);
  auVar14._0_12_ = ZEXT712(0);
  uVar18 = CONCAT32(auVar14._10_3_,(ushort)(byte)(uVar11 >> 0x10));
  auVar20._5_8_ = 0;
  auVar20._0_5_ = uVar18;
  uVar37 = *(undefined4 *)(top + -5);
  uVar1 = (ulong)(ushort)uVar37 & 0xffffffffffff00ff;
  auVar15._8_4_ = 0;
  auVar15._0_8_ = uVar1;
  auVar15[0xc] = (char)((uint)uVar37 >> 0x18);
  auVar16[8] = (char)((uint)uVar37 >> 0x10);
  auVar16._0_8_ = uVar1;
  auVar16[9] = 0;
  auVar16._10_3_ = auVar15._10_3_;
  auVar19._5_8_ = 0;
  auVar19._0_5_ = auVar16._8_5_;
  auVar17[4] = (char)((uint)uVar37 >> 8);
  auVar17._0_4_ = (int)uVar1;
  auVar17[5] = 0;
  auVar17._6_7_ = SUB137(auVar19 << 0x40,6);
  lVar24 = 0;
  do {
    *(uint *)(dst + lVar24 + 0x600) =
         ((uint)(uint3)(auVar15._10_3_ >> 0x10) + (uint)(uint3)(auVar14._10_3_ >> 0x10) +
          auVar17._4_4_ + (int)CONCAT72(SUB137(auVar20 << 0x40,6),(ushort)(byte)(uVar11 >> 8)) +
          auVar16._8_4_ + (int)uVar18 + (int)uVar1 + (uVar11 & 0xff) + 4 >> 3 & 0xff) * 0x1010101;
    lVar24 = lVar24 + 0x20;
  } while (lVar24 != 0x80);
  puVar22 = dst + 0x604;
  uVar37 = *(undefined4 *)top;
  lVar24 = 4;
  do {
    auVar28 = pshuflw(ZEXT416((uint)top[lVar24 + -6] - (uint)top[-1]),
                      ZEXT416((uint)top[lVar24 + -6] - (uint)top[-1]),0);
    sVar26 = auVar28._0_2_ + (ushort)(byte)uVar37;
    sVar31 = auVar28._2_2_ + (ushort)(byte)((uint)uVar37 >> 8);
    sVar33 = auVar28._4_2_ + (ushort)(byte)((uint)uVar37 >> 0x10);
    sVar35 = auVar28._6_2_ + (ushort)(byte)((uint)uVar37 >> 0x18);
    *(uint *)puVar22 =
         CONCAT13((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35),
                  CONCAT12((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33),
                           CONCAT11((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31)
                                    ,(0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 -
                                     (0xff < sVar26))));
    puVar22 = puVar22 + 0x20;
    lVar24 = lVar24 + -1;
  } while (lVar24 != 0);
  uVar1 = *(ulong *)(top + -1);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar1;
  auVar42._8_4_ = (int)uVar1;
  auVar42._0_8_ = uVar1;
  auVar42._12_4_ = (int)(uVar1 >> 0x20);
  uVar47 = (undefined1)(uVar1 >> 0x10);
  auVar40[0] = pavgb((char)uVar1,uVar47);
  uVar48 = (undefined1)(uVar1 >> 0x18);
  uVar36 = (undefined1)(uVar1 >> 8);
  auVar40[1] = pavgb(uVar36,uVar48);
  uVar49 = (undefined1)(uVar1 >> 0x20);
  auVar40[2] = pavgb(uVar47,uVar49);
  uVar50 = (undefined1)(uVar1 >> 0x28);
  auVar40[3] = pavgb(uVar48,uVar50);
  uVar32 = (undefined1)(uVar1 >> 0x30);
  auVar40[4] = pavgb(uVar49,uVar32);
  uVar34 = (undefined1)(uVar1 >> 0x38);
  auVar40[5] = pavgb(uVar50,uVar34);
  auVar40[6] = pavgb(uVar32,0);
  auVar40[7] = pavgb(uVar34,0);
  auVar40[8] = pavgb(0,0);
  auVar40[9] = pavgb(0,0);
  auVar40[10] = pavgb(0,0);
  auVar40[0xb] = pavgb(0,0);
  auVar40[0xc] = pavgb(0,0);
  auVar40[0xd] = pavgb(0,0);
  auVar40[0xe] = pavgb(0,0);
  auVar40[0xf] = pavgb(0,0);
  auVar28 = psubusb(auVar40,(auVar42 >> 0x50 ^ auVar28) & _DAT_0014eb30);
  uVar36 = pavgb(auVar28[0],uVar36);
  uVar47 = pavgb(auVar28[1],uVar47);
  uVar48 = pavgb(auVar28[2],uVar48);
  uVar49 = pavgb(auVar28[3],uVar49);
  pavgb(auVar28[4],uVar50);
  pavgb(auVar28[5],uVar32);
  pavgb(auVar28[6],uVar34);
  pavgb(auVar28[7],0);
  pavgb(auVar28[8],0);
  pavgb(auVar28[9],0);
  pavgb(auVar28[10],0);
  pavgb(auVar28[0xb],0);
  pavgb(auVar28[0xc],0);
  pavgb(auVar28[0xd],0);
  pavgb(auVar28[0xe],0);
  pavgb(auVar28[0xf],0);
  lVar24 = 0;
  do {
    *(uint *)(dst + lVar24 + 0x608) = CONCAT13(uVar49,CONCAT12(uVar48,CONCAT11(uVar47,uVar36)));
    lVar24 = lVar24 + 0x20;
  } while (lVar24 != 0x80);
  bVar3 = top[-2];
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-5];
  *(uint *)(dst + 0x60c) = ((uint)top[-1] + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x62c) = ((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x64c) = ((uint)bVar4 + (uint)bVar5 * 2 + 2 + (uint)bVar6 >> 2) * 0x1010101;
  *(uint *)(dst + 0x66c) = ((uint)bVar5 + (uint)bVar6 + 2 + (uint)bVar6 * 2 >> 2) * 0x1010101;
  auVar28 = _DAT_0014eb30;
  uVar2 = (undefined8)*(unkuint9 *)(top + -5);
  uVar23 = top[3];
  Var13 = *(unkuint9 *)(top + -5);
  uVar48 = (undefined1)((ulong)uVar2 >> 0x10);
  auVar41[0] = pavgb(uVar48,(char)uVar2);
  uVar47 = (undefined1)((ulong)uVar2 >> 8);
  uVar49 = (undefined1)((ulong)uVar2 >> 0x18);
  auVar41[1] = pavgb(uVar49,uVar47);
  uVar50 = (undefined1)((ulong)uVar2 >> 0x20);
  auVar41[2] = pavgb(uVar50,uVar48);
  uVar32 = (undefined1)((ulong)uVar2 >> 0x28);
  auVar41[3] = pavgb(uVar32,uVar49);
  uVar34 = (undefined1)((ulong)uVar2 >> 0x30);
  auVar41[4] = pavgb(uVar34,uVar50);
  uVar36 = (undefined1)((ulong)uVar2 >> 0x38);
  auVar41[5] = pavgb(uVar36,uVar32);
  auVar41[6] = pavgb(uVar23,uVar34);
  auVar41[7] = pavgb(0,uVar36);
  auVar41[8] = pavgb(0,uVar23);
  auVar41[9] = pavgb(0,0);
  auVar41[10] = pavgb(0,0);
  auVar41[0xb] = pavgb(0,0);
  auVar41[0xc] = pavgb(0,0);
  auVar41[0xd] = pavgb(0,0);
  auVar41[0xe] = pavgb(0,0);
  auVar41[0xf] = pavgb(0,0);
  auVar29._9_7_ = 0;
  auVar29._0_9_ = Var13 >> 0x10 ^ Var13;
  auVar42 = psubusb(auVar41,auVar29 & _DAT_0014eb30);
  uVar47 = pavgb(auVar42[0],uVar47);
  uVar48 = pavgb(auVar42[1],uVar48);
  uVar49 = pavgb(auVar42[2],uVar49);
  uVar50 = pavgb(auVar42[3],uVar50);
  uVar37 = CONCAT13(uVar50,CONCAT12(uVar49,CONCAT11(uVar48,uVar47)));
  uVar47 = pavgb(auVar42[4],uVar32);
  uVar38 = CONCAT14(uVar47,uVar37);
  uVar47 = pavgb(auVar42[5],uVar34);
  uVar39 = CONCAT15(uVar47,uVar38);
  uVar47 = pavgb(auVar42[6],uVar36);
  pavgb(auVar42[7],uVar23);
  pavgb(auVar42[8],0);
  pavgb(auVar42[9],0);
  pavgb(auVar42[10],0);
  pavgb(auVar42[0xb],0);
  pavgb(auVar42[0xc],0);
  pavgb(auVar42[0xd],0);
  pavgb(auVar42[0xe],0);
  pavgb(auVar42[0xf],0);
  *(undefined4 *)(dst + 0x670) = uVar37;
  *(int *)(dst + 0x650) = (int)((uint5)uVar38 >> 8);
  *(int *)(dst + 0x630) = (int)((uint6)uVar39 >> 0x10);
  *(int *)(dst + 0x610) = (int)(CONCAT16(uVar47,uVar39) >> 0x18);
  bVar3 = (byte)*(ushort *)(top + -2);
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-1];
  uVar12 = *(ushort *)(top + -2);
  uVar1 = *(ulong *)(top + -1);
  auVar43._0_8_ = uVar1 >> 8;
  auVar43._8_8_ = 0;
  uVar21 = uVar1 & 0xffffffffffff00;
  auVar52._8_8_ = uVar1 >> 0x38;
  auVar52._0_8_ = uVar21 << 8 | (ulong)uVar12;
  uVar48 = (undefined1)(uVar1 >> 8);
  auVar57[0] = pavgb((char)uVar12,uVar48);
  uVar49 = (undefined1)(uVar1 >> 0x10);
  auVar57[1] = pavgb((char)(uVar12 >> 8),uVar49);
  uVar50 = (undefined1)(uVar1 >> 0x18);
  auVar57[2] = pavgb((char)(uVar21 >> 8),uVar50);
  uVar32 = (undefined1)(uVar1 >> 0x20);
  auVar57[3] = pavgb((char)(uVar21 >> 0x10),uVar32);
  uVar34 = (undefined1)(uVar1 >> 0x28);
  auVar57[4] = pavgb((char)(uVar21 >> 0x18),uVar34);
  uVar36 = (undefined1)(uVar1 >> 0x30);
  auVar57[5] = pavgb((char)(uVar21 >> 0x20),uVar36);
  uVar51 = (undefined1)(uVar1 >> 0x38);
  auVar57[6] = pavgb((char)(uVar21 >> 0x28),uVar51);
  auVar57[7] = pavgb((char)(uVar21 >> 0x30),0);
  auVar57[8] = pavgb(uVar51,0);
  auVar57[9] = pavgb(0,0);
  auVar57[10] = pavgb(0,0);
  auVar57[0xb] = pavgb(0,0);
  auVar57[0xc] = pavgb(0,0);
  auVar57[0xd] = pavgb(0,0);
  auVar57[0xe] = pavgb(0,0);
  auVar57[0xf] = pavgb(0,0);
  auVar42 = psubusb(auVar57,(auVar52 ^ auVar43) & auVar28);
  uVar47 = pavgb(auVar42[0],(char)uVar1);
  uVar59 = pavgb(auVar42[1],uVar48);
  uVar60 = pavgb(auVar42[2],uVar49);
  uVar61 = pavgb(auVar42[3],uVar50);
  iVar56 = CONCAT13(uVar61,CONCAT12(uVar60,CONCAT11(uVar59,uVar47)));
  pavgb(auVar42[4],uVar32);
  pavgb(auVar42[5],uVar34);
  pavgb(auVar42[6],uVar36);
  pavgb(auVar42[7],uVar51);
  pavgb(auVar42[8],0);
  pavgb(auVar42[9],0);
  pavgb(auVar42[10],0);
  pavgb(auVar42[0xb],0);
  pavgb(auVar42[0xc],0);
  pavgb(auVar42[0xd],0);
  pavgb(auVar42[0xe],0);
  pavgb(auVar42[0xf],0);
  uVar47 = pavgb((char)uVar1,uVar48);
  uVar48 = pavgb(uVar48,uVar49);
  uVar49 = pavgb(uVar49,uVar50);
  uVar50 = pavgb(uVar50,uVar32);
  iVar27 = CONCAT13(uVar50,CONCAT12(uVar49,CONCAT11(uVar48,uVar47)));
  pavgb(uVar32,uVar34);
  pavgb(uVar34,uVar36);
  pavgb(uVar36,uVar51);
  pavgb(uVar51,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  *(int *)(dst + 0x614) = iVar27;
  *(int *)(dst + 0x634) = iVar56;
  *(int *)(dst + 0x654) = iVar27 << 8;
  *(int *)(dst + 0x674) = iVar56 << 8;
  dst[0x654] = (uint8_t)((uint)bVar4 + (uint)bVar3 * 2 + (uint)bVar6 + 2 >> 2);
  dst[0x674] = (uint8_t)((uint)bVar5 + (uint)bVar3 + (uint)bVar4 * 2 + 2 >> 2);
  uVar1 = *(ulong *)top;
  auVar44._8_4_ = (int)uVar1;
  auVar44._0_8_ = uVar1;
  auVar44._12_4_ = (int)(uVar1 >> 0x20);
  uVar47 = (undefined1)(uVar1 >> 0x10);
  auVar53[0] = pavgb((char)uVar1,uVar47);
  uVar48 = (undefined1)(uVar1 >> 0x18);
  uVar36 = (undefined1)(uVar1 >> 8);
  auVar53[1] = pavgb(uVar36,uVar48);
  uVar49 = (undefined1)(uVar1 >> 0x20);
  auVar53[2] = pavgb(uVar47,uVar49);
  uVar50 = (undefined1)(uVar1 >> 0x28);
  auVar53[3] = pavgb(uVar48,uVar50);
  uVar32 = (undefined1)(uVar1 >> 0x30);
  auVar53[4] = pavgb(uVar49,uVar32);
  uVar34 = (undefined1)(uVar1 >> 0x38);
  auVar53[5] = pavgb(uVar50,uVar34);
  auVar53[6] = pavgb(uVar32,top[7]);
  auVar53[7] = pavgb(uVar34,0);
  auVar53[8] = pavgb(0,0);
  auVar53[9] = pavgb(0,0);
  auVar53[10] = pavgb(0,0);
  auVar53[0xb] = pavgb(0,0);
  auVar53[0xc] = pavgb(0,0);
  auVar53[0xd] = pavgb(0,0);
  auVar53[0xe] = pavgb(0,0);
  auVar53[0xf] = pavgb(0,0);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = (auVar44._8_8_ >> 0x10 | (ulong)top[7] << 0x30) ^ uVar1;
  auVar28 = psubusb(auVar53,auVar45 & auVar28);
  uVar36 = pavgb(auVar28[0],uVar36);
  uVar47 = pavgb(auVar28[1],uVar47);
  uVar48 = pavgb(auVar28[2],uVar48);
  uVar49 = pavgb(auVar28[3],uVar49);
  uVar37 = CONCAT13(uVar49,CONCAT12(uVar48,CONCAT11(uVar47,uVar36)));
  uVar47 = pavgb(auVar28[4],uVar50);
  uVar38 = CONCAT14(uVar47,uVar37);
  uVar47 = pavgb(auVar28[5],uVar32);
  uVar39 = CONCAT15(uVar47,uVar38);
  uVar47 = pavgb(auVar28[6],uVar34);
  pavgb(auVar28[7],0);
  pavgb(auVar28[8],0);
  pavgb(auVar28[9],0);
  pavgb(auVar28[10],0);
  pavgb(auVar28[0xb],0);
  pavgb(auVar28[0xc],0);
  pavgb(auVar28[0xd],0);
  pavgb(auVar28[0xe],0);
  pavgb(auVar28[0xf],0);
  *(undefined4 *)(dst + 0x618) = uVar37;
  *(int *)(dst + 0x638) = (int)((uint5)uVar38 >> 8);
  *(int *)(dst + 0x658) = (int)((uint6)uVar39 >> 0x10);
  *(int *)(dst + 0x678) = (int)(CONCAT16(uVar47,uVar39) >> 0x18);
  uVar1 = *(ulong *)top;
  auVar30._0_8_ = uVar1 >> 8;
  auVar30._8_8_ = 0;
  auVar46._8_4_ = (int)uVar1;
  auVar46._0_8_ = uVar1;
  auVar46._12_4_ = (int)(uVar1 >> 0x20);
  uVar47 = (undefined1)(uVar1 >> 8);
  uVar51 = pavgb((char)uVar1,uVar47);
  uVar48 = (undefined1)(uVar1 >> 0x10);
  uVar59 = pavgb(uVar47,uVar48);
  uVar49 = (undefined1)(uVar1 >> 0x18);
  uVar60 = pavgb(uVar48,uVar49);
  uVar50 = (undefined1)(uVar1 >> 0x20);
  uVar61 = pavgb(uVar49,uVar50);
  uVar37 = CONCAT13(uVar61,CONCAT12(uVar60,CONCAT11(uVar59,uVar51)));
  uVar32 = (undefined1)(uVar1 >> 0x28);
  uVar55 = pavgb(uVar50,uVar32);
  auVar54._0_5_ = CONCAT14(uVar55,uVar37);
  uVar34 = (undefined1)(uVar1 >> 0x30);
  auVar54[5] = pavgb(uVar32,uVar34);
  uVar36 = (undefined1)(uVar1 >> 0x38);
  auVar54[6] = pavgb(uVar34,uVar36);
  auVar54[7] = pavgb(uVar36,0);
  auVar54[8] = pavgb(0,0);
  auVar54[9] = pavgb(0,0);
  auVar54[10] = pavgb(0,0);
  auVar54[0xb] = pavgb(0,0);
  auVar54[0xc] = pavgb(0,0);
  auVar54[0xd] = pavgb(0,0);
  auVar54[0xe] = pavgb(0,0);
  auVar54[0xf] = pavgb(0,0);
  auVar58[0] = pavgb(uVar48,uVar47);
  auVar58[1] = pavgb(uVar49,uVar48);
  auVar58[2] = pavgb(uVar50,uVar49);
  auVar58[3] = pavgb(uVar32,uVar50);
  auVar58[4] = pavgb(uVar34,uVar32);
  auVar58[5] = pavgb(uVar36,uVar34);
  auVar58[6] = pavgb(0,uVar36);
  auVar58[7] = pavgb(0,0);
  auVar58[8] = pavgb(0,0);
  auVar58[9] = pavgb(0,0);
  auVar58[10] = pavgb(0,0);
  auVar58[0xb] = pavgb(0,0);
  auVar58[0xc] = pavgb(0,0);
  auVar58[0xd] = pavgb(0,0);
  auVar58[0xe] = pavgb(0,0);
  auVar58[0xf] = pavgb(0,0);
  auVar62[0] = pavgb(uVar51,auVar58[0]);
  auVar62[1] = pavgb(uVar59,auVar58[1]);
  auVar62[2] = pavgb(uVar60,auVar58[2]);
  auVar62[3] = pavgb(uVar61,auVar58[3]);
  auVar62[4] = pavgb(uVar55,auVar58[4]);
  auVar62[5] = pavgb(auVar54[5],auVar58[5]);
  auVar62[6] = pavgb(auVar54[6],auVar58[6]);
  auVar62[7] = pavgb(auVar54[7],auVar58[7]);
  auVar62[8] = pavgb(auVar54[8],auVar58[8]);
  auVar62[9] = pavgb(auVar54[9],auVar58[9]);
  auVar62[10] = pavgb(auVar54[10],auVar58[10]);
  auVar62[0xb] = pavgb(auVar54[0xb],auVar58[0xb]);
  auVar62[0xc] = pavgb(auVar54[0xc],auVar58[0xc]);
  auVar62[0xd] = pavgb(auVar54[0xd],auVar58[0xd]);
  auVar62[0xe] = pavgb(auVar54[0xe],auVar58[0xe]);
  auVar62[0xf] = pavgb(auVar54[0xf],auVar58[0xf]);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar1 ^ auVar30._0_8_;
  auVar28 = psubusb(auVar62,(auVar46 >> 0x50 ^ auVar30 | auVar25) & (auVar58 ^ auVar54) &
                            _DAT_0014eb30);
  *(undefined4 *)(dst + 0x61c) = uVar37;
  *(int *)(dst + 0x63c) = auVar28._0_4_;
  *(int *)(dst + 0x65c) = (int)((uint5)auVar54._0_5_ >> 8);
  *(int *)(dst + 0x67c) = auVar28._1_4_;
  dst[0x65f] = auVar28[4];
  dst[0x67f] = auVar28[5];
  bVar3 = top[-1];
  bVar4 = top[-2];
  bVar5 = top[-3];
  bVar6 = top[-4];
  bVar7 = top[-5];
  bVar8 = *top;
  bVar9 = top[1];
  bVar10 = top[2];
  uVar23 = (uint8_t)((uint)bVar4 + (uint)bVar3 + 1 >> 1);
  dst[0x6a2] = uVar23;
  dst[0x680] = uVar23;
  uVar23 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x6c2] = uVar23;
  dst[0x6a0] = uVar23;
  uVar23 = (uint8_t)((uint)bVar6 + (uint)bVar5 + 1 >> 1);
  dst[0x6e2] = uVar23;
  dst[0x6c0] = uVar23;
  dst[0x6e0] = (uint8_t)((uint)bVar6 + (uint)bVar7 + 1 >> 1);
  dst[0x683] = (uint8_t)((uint)bVar10 + (uint)bVar8 + (uint)bVar9 * 2 + 2 >> 2);
  dst[0x682] = (uint8_t)((uint)bVar3 + (uint)bVar8 * 2 + 2 + (uint)bVar9 >> 2);
  uVar23 = (uint8_t)((uint)bVar4 + (uint)bVar3 * 2 + 2 + (uint)bVar8 >> 2);
  dst[0x6a3] = uVar23;
  dst[0x681] = uVar23;
  uVar23 = (uint8_t)((uint)bVar3 + (uint)bVar5 + 2 + (uint)bVar4 * 2 >> 2);
  dst[0x6c3] = uVar23;
  dst[0x6a1] = uVar23;
  uVar23 = (uint8_t)((uint)bVar4 + (uint)bVar6 + 2 + (uint)bVar5 * 2 >> 2);
  dst[0x6e3] = uVar23;
  dst[0x6c1] = uVar23;
  dst[0x6e1] = (uint8_t)((uint)bVar5 + (uint)bVar7 + (uint)bVar6 * 2 + 2 >> 2);
  bVar3 = top[-2];
  bVar4 = top[-3];
  bVar5 = top[-4];
  bVar6 = top[-5];
  dst[0x684] = (uint8_t)((uint)bVar4 + (uint)bVar3 + 1 >> 1);
  uVar23 = (uint8_t)((uint)bVar4 + (uint)bVar5 + 1 >> 1);
  dst[0x6a4] = uVar23;
  dst[0x686] = uVar23;
  uVar23 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x6c4] = uVar23;
  dst[0x6a6] = uVar23;
  dst[0x685] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  uVar23 = (uint8_t)((uint)bVar4 + (uint)bVar6 + (uint)bVar5 * 2 + 2 >> 2);
  dst[0x6a5] = uVar23;
  dst[0x687] = uVar23;
  uVar23 = (uint8_t)((uint)bVar5 + (uint)bVar6 + 2 + (uint)bVar6 * 2 >> 2);
  dst[0x6c5] = uVar23;
  dst[0x6a7] = uVar23;
  auVar28 = pshuflw(ZEXT216(CONCAT11(bVar6,bVar6)),ZEXT216(CONCAT11(bVar6,bVar6)),0);
  *(int *)(dst + 0x6e4) = auVar28._0_4_;
  dst[0x6c6] = bVar6;
  dst[0x6c7] = bVar6;
  return;
}

Assistant:

static WEBP_INLINE void DC4_SSE2(uint8_t* dst, const uint8_t* top) {
  uint32_t dc = 4;
  int i;
  for (i = 0; i < 4; ++i) dc += top[i] + top[-5 + i];
  Fill_SSE2(dst, dc >> 3, 4);
}